

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcList.c
# Opt level: O3

void Mvc_ListAddCubeTail_(Mvc_List_t *pList,Mvc_Cube_t *pCube)

{
  Mvc_List_t *pMVar1;
  
  pMVar1 = pList;
  if (pList->pHead != (Mvc_Cube_t *)0x0) {
    pMVar1 = (Mvc_List_t *)pList->pTail;
  }
  pMVar1->pHead = pCube;
  pList->pTail = pCube;
  pCube->pNext = (Mvc_Cube_t *)0x0;
  pList->nItems = pList->nItems + 1;
  return;
}

Assistant:

void Mvc_ListAddCubeTail_( Mvc_List_t * pList, Mvc_Cube_t * pCube )
{
    if ( pList->pHead == NULL )
        pList->pHead = pCube;
    else
        Mvc_CubeSetNext( pList->pTail, pCube );
    pList->pTail    = pCube;
    Mvc_CubeSetNext( pCube, NULL );
    pList->nItems++;
}